

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int mbedtls_cipher_cmac_starts(mbedtls_cipher_context_t *ctx,uchar *key,size_t keybits)

{
  mbedtls_cipher_type_t mVar1;
  mbedtls_cmac_context_t *buf;
  int retval;
  mbedtls_cmac_context_t *cmac_ctx;
  mbedtls_cipher_type_t type;
  size_t keybits_local;
  uchar *key_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if (((ctx == (mbedtls_cipher_context_t *)0x0) ||
      (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0)) || (key == (uchar *)0x0)) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    ctx_local._4_4_ = mbedtls_cipher_setkey(ctx,key,(int)keybits,MBEDTLS_ENCRYPT);
    if (ctx_local._4_4_ == 0) {
      mVar1 = ctx->cipher_info->type;
      if ((mVar1 - MBEDTLS_CIPHER_AES_128_ECB < 3) || (mVar1 == MBEDTLS_CIPHER_DES_EDE3_ECB)) {
        buf = (mbedtls_cmac_context_t *)calloc(1,0x28);
        if (buf == (mbedtls_cmac_context_t *)0x0) {
          ctx_local._4_4_ = -0x6180;
        }
        else {
          ctx->cmac_ctx = buf;
          mbedtls_platform_zeroize(buf,0x10);
          ctx_local._4_4_ = 0;
        }
      }
      else {
        ctx_local._4_4_ = -0x6100;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_cmac_starts( mbedtls_cipher_context_t *ctx,
                                const unsigned char *key, size_t keybits )
{
    mbedtls_cipher_type_t type;
    mbedtls_cmac_context_t *cmac_ctx;
    int retval;

    if( ctx == NULL || ctx->cipher_info == NULL || key == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( ( retval = mbedtls_cipher_setkey( ctx, key, (int)keybits,
                                          MBEDTLS_ENCRYPT ) ) != 0 )
        return( retval );

    type = ctx->cipher_info->type;

    switch( type )
    {
        case MBEDTLS_CIPHER_AES_128_ECB:
        case MBEDTLS_CIPHER_AES_192_ECB:
        case MBEDTLS_CIPHER_AES_256_ECB:
        case MBEDTLS_CIPHER_DES_EDE3_ECB:
            break;
        default:
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    /* Allocated and initialise in the cipher context memory for the CMAC
     * context */
    cmac_ctx = mbedtls_calloc( 1, sizeof( mbedtls_cmac_context_t ) );
    if( cmac_ctx == NULL )
        return( MBEDTLS_ERR_CIPHER_ALLOC_FAILED );

    ctx->cmac_ctx = cmac_ctx;

    mbedtls_platform_zeroize( cmac_ctx->state, sizeof( cmac_ctx->state ) );

    return 0;
}